

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v3.cpp
# Opt level: O1

void __thiscall
LASreadItemCompressed_RGB14_v3::~LASreadItemCompressed_RGB14_v3
          (LASreadItemCompressed_RGB14_v3 *this)

{
  ArithmeticModel *m;
  ArithmeticDecoder *this_00;
  long lVar1;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015e8c0;
  lVar1 = 0;
  do {
    m = *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 6);
    if (m != (ArithmeticModel *)0x0) {
      ArithmeticDecoder::destroySymbolModel(this->dec_RGB,m);
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0xe));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x16));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x1e));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x26));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x2e));
      ArithmeticDecoder::destroySymbolModel
                (this->dec_RGB,
                 *(ArithmeticModel **)((long)this->contexts[0].last_item + lVar1 + 0x36));
    }
    lVar1 = lVar1 + 0x40;
  } while (lVar1 != 0x100);
  if (this->instream_RGB != (ByteStreamInArray *)0x0) {
    (*(this->instream_RGB->super_ByteStreamIn)._vptr_ByteStreamIn[0xe])();
    this_00 = this->dec_RGB;
    if (this_00 != (ArithmeticDecoder *)0x0) {
      ArithmeticDecoder::~ArithmeticDecoder(this_00);
      operator_delete(this_00);
    }
  }
  if (this->bytes != (U8 *)0x0) {
    operator_delete__(this->bytes);
    return;
  }
  return;
}

Assistant:

LASreadItemCompressed_RGB14_v3::~LASreadItemCompressed_RGB14_v3()
{
  /* destroy all initialized scanner channel contexts */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    if (contexts[c].m_byte_used)
    {
      dec_RGB->destroySymbolModel(contexts[c].m_byte_used);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_0);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_1);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_2);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_3);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_4);
      dec_RGB->destroySymbolModel(contexts[c].m_rgb_diff_5);
    }
  }

  /* destroy all instreams and decoders */

  if (instream_RGB)
  {
    delete instream_RGB;

    delete dec_RGB;
  }

  if (bytes) delete [] bytes;
}